

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_tonumber(lua_State *L)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s;
  lua_Integer lVar4;
  size_t sVar5;
  double local_68;
  int local_58;
  double dStack_50;
  int digit;
  lua_Number n_1;
  int neg;
  int base;
  char *e;
  char *s;
  size_t l;
  lua_Number n;
  lua_State *plStack_18;
  int isnum;
  lua_State *L_local;
  
  plStack_18 = L;
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    l = (size_t)lua_tonumberx(plStack_18,1,(int *)((long)&n + 4));
    if (n._4_4_ != 0) {
      lua_pushnumber(plStack_18,(lua_Number)l);
      return 1;
    }
    luaL_checkany(plStack_18,1);
  }
  else {
    __s = luaL_checklstring(plStack_18,1,(size_t *)&s);
    lVar4 = luaL_checkinteger(plStack_18,2);
    iVar2 = (int)lVar4;
    bVar1 = false;
    if ((iVar2 < 2) || (0x24 < iVar2)) {
      luaL_argerror(plStack_18,2,"base out of range");
    }
    sVar5 = strspn(__s," \f\n\r\t\v");
    e = __s + sVar5;
    if (*e == '-') {
      e = e + 1;
      bVar1 = true;
    }
    else if (*e == '+') {
      e = e + 1;
    }
    iVar3 = isalnum((uint)(byte)*e);
    if (iVar3 != 0) {
      dStack_50 = 0.0;
      do {
        iVar3 = isdigit((uint)(byte)*e);
        if (iVar3 == 0) {
          local_58 = toupper((uint)(byte)*e);
          local_58 = local_58 + -0x37;
        }
        else {
          local_58 = *e + -0x30;
        }
        if (iVar2 <= local_58) break;
        dStack_50 = dStack_50 * (double)iVar2 + (double)local_58;
        e = e + 1;
        iVar3 = isalnum((uint)(byte)*e);
      } while (iVar3 != 0);
      sVar5 = strspn(e," \f\n\r\t\v");
      if (e + sVar5 == __s + (long)s) {
        if (bVar1) {
          local_68 = -dStack_50;
        }
        else {
          local_68 = dStack_50;
        }
        lua_pushnumber(plStack_18,local_68);
        return 1;
      }
    }
  }
  lua_pushnil(plStack_18);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion */
    int isnum;
    lua_Number n = lua_tonumberx(L, 1, &isnum);
    if (isnum) {
      lua_pushnumber(L, n);
      return 1;
    }  /* else not a number; must be something */
    luaL_checkany(L, 1);
  }
  else {
    size_t l;
    const char *s = luaL_checklstring(L, 1, &l);
    const char *e = s + l;  /* end point for 's' */
    int base = luaL_checkint(L, 2);
    int neg = 0;
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    s += strspn(s, SPACECHARS);  /* skip initial spaces */
    if (*s == '-') { s++; neg = 1; }  /* handle signal */
    else if (*s == '+') s++;
    if (isalnum((unsigned char)*s)) {
      lua_Number n = 0;
      do {
        int digit = (isdigit((unsigned char)*s)) ? *s - '0'
                       : toupper((unsigned char)*s) - 'A' + 10;
        if (digit >= base) break;  /* invalid numeral; force a fail */
        n = n * (lua_Number)base + (lua_Number)digit;
        s++;
      } while (isalnum((unsigned char)*s));
      s += strspn(s, SPACECHARS);  /* skip trailing spaces */
      if (s == e) {  /* no invalid trailing characters? */
        lua_pushnumber(L, (neg) ? -n : n);
        return 1;
      }  /* else not a number */
    }  /* else not a number */
  }
  lua_pushnil(L);  /* not a number */
  return 1;
}